

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_indices_encoding_observer.h
# Opt level: O2

void __thiscall
draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::OnNewVertexVisited
          (MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *this,
          VertexIndex vertex,CornerIndex corner)

{
  int iVar1;
  MeshAttributeIndicesEncodingData *pMVar2;
  CornerIndex corner_local;
  
  corner_local = corner;
  PointsSequencer::AddPointId
            (this->sequencer_,
             (PointIndex)
             (this->mesh_->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(ulong)corner.value_ / 3]._M_elems
             [(ulong)corner.value_ % 3].value_);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::push_back(&this->encoding_data_->encoded_attribute_value_index_to_corner_map,&corner_local);
  pMVar2 = this->encoding_data_;
  iVar1 = pMVar2->num_values;
  (pMVar2->vertex_to_encoded_attribute_value_index_map).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [vertex.value_] = iVar1;
  pMVar2->num_values = iVar1 + 1;
  return;
}

Assistant:

inline void OnNewVertexVisited(VertexIndex vertex, CornerIndex corner) {
    const PointIndex point_id =
        mesh_->face(FaceIndex(corner.value() / 3))[corner.value() % 3];
    // Append the visited attribute to the encoding order.
    sequencer_->AddPointId(point_id);

    // Keep track of visited corners.
    encoding_data_->encoded_attribute_value_index_to_corner_map.push_back(
        corner);

    encoding_data_
        ->vertex_to_encoded_attribute_value_index_map[vertex.value()] =
        encoding_data_->num_values;

    encoding_data_->num_values++;
  }